

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v11::detail::dragonbox::remove_trailing_zeros(uint64_t *n)

{
  int iVar1;
  uint64_t uVar2;
  unsigned_long uVar3;
  uint64_t q;
  uint64_t q_1;
  int s;
  uint64_t mod_inv_25;
  uint64_t mod_inv_5;
  int s_1;
  uint32_t n32;
  uint128_fallback nm;
  uint64_t magic_number;
  uint64_t *n_local;
  
  if (*n == 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/format-inl.h"
                ,0x48c,"");
  }
  nm.hi_ = 0xabcc77118461cefd;
  _s_1 = umul128(*n,0xabcc77118461cefd);
  uVar2 = uint128_fallback::high((uint128_fallback *)&s_1);
  if (((uVar2 & 0x3ffffff) == 0) &&
     (uVar2 = uint128_fallback::low((uint128_fallback *)&s_1), uVar2 < 0xabcc77118461cefd)) {
    uVar2 = uint128_fallback::high((uint128_fallback *)&s_1);
    mod_inv_5._4_4_ = (uint)(uVar2 >> 0x1a);
    iVar1 = remove_trailing_zeros((uint32_t *)((long)&mod_inv_5 + 4),8);
    *n = (ulong)mod_inv_5._4_4_;
    return iVar1;
  }
  q_1._4_4_ = 0;
  while( true ) {
    uVar2 = rotr(*n * -0x70a3d70a3d70a3d7,2);
    uVar3 = max_value<unsigned_long>();
    if (uVar3 / 100 < uVar2) break;
    *n = uVar2;
    q_1._4_4_ = q_1._4_4_ + 2;
  }
  uVar2 = rotr(*n * -0x3333333333333333,1);
  uVar3 = max_value<unsigned_long>();
  if (uVar2 <= uVar3 / 10) {
    *n = uVar2;
    q_1._4_4_ = q_1._4_4_ | 1;
  }
  return q_1._4_4_;
}

Assistant:

FMT_INLINE int remove_trailing_zeros(uint64_t& n) noexcept {
  FMT_ASSERT(n != 0, "");

  // This magic number is ceil(2^90 / 10^8).
  constexpr uint64_t magic_number = 12379400392853802749ull;
  auto nm = umul128(n, magic_number);

  // Is n is divisible by 10^8?
  if ((nm.high() & ((1ull << (90 - 64)) - 1)) == 0 && nm.low() < magic_number) {
    // If yes, work with the quotient...
    auto n32 = static_cast<uint32_t>(nm.high() >> (90 - 64));
    // ... and use the 32 bit variant of the function
    int s = remove_trailing_zeros(n32, 8);
    n = n32;
    return s;
  }

  // If n is not divisible by 10^8, work with n itself.
  constexpr uint64_t mod_inv_5 = 0xcccccccccccccccd;
  constexpr uint64_t mod_inv_25 = 0x8f5c28f5c28f5c29;  // mod_inv_5 * mod_inv_5

  int s = 0;
  while (true) {
    auto q = rotr(n * mod_inv_25, 2);
    if (q > max_value<uint64_t>() / 100) break;
    n = q;
    s += 2;
  }
  auto q = rotr(n * mod_inv_5, 1);
  if (q <= max_value<uint64_t>() / 10) {
    n = q;
    s |= 1;
  }

  return s;
}